

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.h
# Opt level: O0

void __thiscall CTcPrsSymtab::add_to_range(CTcPrsSymtab *this,int ofs)

{
  int ofs_local;
  CTcPrsSymtab *this_local;
  
  if ((this->start_ofs_ == 0) || (ofs < this->start_ofs_)) {
    this->start_ofs_ = ofs;
  }
  if (this->end_ofs_ < ofs) {
    this->end_ofs_ = ofs;
  }
  return;
}

Assistant:

void add_to_range(int ofs)
    {
        /* 
         *   if we don't have a starting offset yet, or this is before it,
         *   this is the new start offset 
         */
        if (start_ofs_ == 0 || ofs < start_ofs_)
            start_ofs_ = ofs;

        /* 
         *   if we don't have an ending offset yet, or this is after it, this
         *   is the ending offset 
         */
        if (ofs > end_ofs_)
            end_ofs_ = ofs;
    }